

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knn_graph.h
# Opt level: O2

void __thiscall
gnns::Knn_Graph<L2Distance<float>_>::save_graph
          (Knn_Graph<L2Distance<float>_> *this,string *index_file_path,string *dist_file_path)

{
  save_to_file<unsigned_int>(&this->indices,index_file_path);
  save_to_file<float>(&this->distances,dist_file_path);
  return;
}

Assistant:

void save_graph(const std::string& index_file_path, const std::string& dist_file_path)
        {
            try{
                save_to_file<IndexType>(indices, index_file_path);
                save_to_file<DistanceType>(distances, dist_file_path);
            }catch (std::exception& e){
                throw e;
            }
        }